

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O0

void __thiscall
Vault::Client::Client
          (Client *this,Config *config,AuthenticationStrategy *authStrategy,
          HttpErrorCallback *httpErrorCallback,ResponseErrorCallback *responseErrorCallback)

{
  bool *this_00;
  bool bVar1;
  AuthenticationResponse *pAVar2;
  undefined1 local_178 [8];
  optional<Vault::AuthenticationResponse> result;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_110;
  Config local_f0;
  ResponseErrorCallback *local_30;
  ResponseErrorCallback *responseErrorCallback_local;
  HttpErrorCallback *httpErrorCallback_local;
  AuthenticationStrategy *authStrategy_local;
  Config *config_local;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_0026d970;
  local_30 = responseErrorCallback;
  responseErrorCallback_local = (ResponseErrorCallback *)httpErrorCallback;
  httpErrorCallback_local = (HttpErrorCallback *)authStrategy;
  authStrategy_local = (AuthenticationStrategy *)config;
  config_local = (Config *)this;
  bVar1 = Config::getDebug(config);
  this->debug_ = bVar1;
  bVar1 = Config::getTls((Config *)authStrategy_local);
  this->tls_ = bVar1;
  Config::getHost_abi_cxx11_(&this->host_,(Config *)authStrategy_local);
  Config::getPort_abi_cxx11_(&this->port_,(Config *)authStrategy_local);
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->token_);
  Config::getNamespace_abi_cxx11_(&this->namespace_,(Config *)authStrategy_local);
  Config::Config(&local_f0,(Config *)authStrategy_local);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&local_110,httpErrorCallback);
  this_00 = &result.super__Optional_base<Vault::AuthenticationResponse,_false,_false>._M_payload.
             super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
             super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged;
  std::function<void_(const_Vault::HttpResponse_&)>::function
            ((function<void_(const_Vault::HttpResponse_&)> *)this_00,responseErrorCallback);
  HttpClient::HttpClient(&this->httpClient_,&local_f0,&local_110,(ResponseErrorCallback *)this_00);
  std::function<void_(const_Vault::HttpResponse_&)>::~function
            ((function<void_(const_Vault::HttpResponse_&)> *)
             &result.super__Optional_base<Vault::AuthenticationResponse,_false,_false>._M_payload.
              super__Optional_payload<Vault::AuthenticationResponse,_true,_false,_false>.
              super__Optional_payload_base<Vault::AuthenticationResponse>._M_engaged);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  ~function(&local_110);
  Config::~Config(&local_f0);
  this->authStrategy_ = (AuthenticationStrategy *)httpErrorCallback_local;
  Config::getCaBundle_abi_cxx11_(&this->caBundle_,(Config *)authStrategy_local);
  (*this->authStrategy_->_vptr_AuthenticationStrategy[2])(local_178);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_178);
  if (bVar1) {
    pAVar2 = std::optional<Vault::AuthenticationResponse>::value
                       ((optional<Vault::AuthenticationResponse> *)local_178);
    Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&this->token_,&pAVar2->token);
  }
  std::optional<Vault::AuthenticationResponse>::~optional
            ((optional<Vault::AuthenticationResponse> *)local_178);
  return;
}

Assistant:

Vault::Client::Client(Vault::Config &config,
                      AuthenticationStrategy &authStrategy,
                      HttpErrorCallback httpErrorCallback,
                      ResponseErrorCallback responseErrorCallback)
    : debug_(config.getDebug())
    , tls_(config.getTls())
    , host_(config.getHost())
    , port_(config.getPort())
    , namespace_(config.getNamespace())
    , httpClient_(HttpClient(config, std::move(httpErrorCallback),
                             std::move(responseErrorCallback)))
    , authStrategy_(authStrategy)
    , caBundle_(config.getCaBundle()) {
  if (auto result = authStrategy_.authenticate(*this)) {
    token_ = result.value().token;
  }
}